

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::SelectBinder::BindUnnest
          (BindResult *__return_storage_ptr__,SelectBinder *this,FunctionExpression *function,
          idx_t depth,bool root_expression)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_00;
  idx_t *piVar1;
  LogicalTypeId LVar2;
  Binder *binder;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  long lVar4;
  ClientContext *pCVar5;
  pointer ppVar6;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var7;
  _Alloc_hider _Var8;
  element_type *peVar9;
  char cVar10;
  element_type *peVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  uint32_t uVar15;
  pointer pOVar16;
  pointer puVar17;
  pointer pPVar18;
  reference pvVar19;
  type pEVar20;
  type pPVar21;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar22;
  pointer pEVar23;
  LogicalType *other;
  LogicalType *pLVar24;
  pointer pBVar25;
  iterator iVar26;
  child_list_t<LogicalType> *pcVar27;
  long lVar28;
  ParameterNotAllowedException *this_01;
  InvalidInputException *this_02;
  BinderException *pBVar29;
  ParameterNotResolvedException *this_03;
  pointer puVar30;
  Value *this_04;
  ulong uVar31;
  element_type *this_05;
  idx_t iVar32;
  pointer ppVar33;
  ulong local_3e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3d8;
  BindResult *local_3d0;
  string alias;
  element_type *local_398;
  BoundUnnestNode unnest_node;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_370;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_368;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_360;
  Value value;
  idx_t depth_local;
  long local_2c0;
  idx_t current_level;
  LogicalType return_type;
  string local_290;
  ErrorData error;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  ErrorData local_1b0;
  ErrorData local_130;
  ErrorData local_b0;
  
  local_3d0 = __return_storage_ptr__;
  depth_local = depth;
  if (depth != 0) {
    ::std::__cxx11::string::string
              ((string *)&value,"UNNEST() for correlated expressions is not supported yet",
               (allocator *)&alias);
    BinderException::BinderException<>
              ((BinderException *)&error,&function->super_ParsedExpression,(string *)&value);
    BindResult::BindResult(local_3d0,(Exception *)&error);
    ::std::runtime_error::~runtime_error((runtime_error *)&error);
    ::std::__cxx11::string::~string((string *)&value);
    return local_3d0;
  }
  ErrorData::ErrorData(&error);
  if ((function->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (function->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::string
              ((string *)&value,"UNNEST() requires a single argument",(allocator *)&unnest_node);
    BinderException::BinderException<>
              ((BinderException *)&alias,&function->super_ParsedExpression,(string *)&value);
    BindResult::BindResult(local_3d0,(Exception *)&alias);
LAB_0128f930:
    ::std::runtime_error::~runtime_error((runtime_error *)&alias);
  }
  else {
    if ((this->super_BaseSelectBinder).inside_window == true) {
      (*(this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[0xe])
                (&value,this);
      BinderException::BinderException<>
                ((BinderException *)&alias,&function->super_ParsedExpression,(string *)&value);
      BindResult::BindResult(local_3d0,(Exception *)&alias);
      goto LAB_0128f930;
    }
    if (((function->distinct != false) ||
        ((function->filter).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
         (ParsedExpression *)0x0)) ||
       (pOVar16 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(&function->order_bys),
       (pOVar16->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pOVar16->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&value,
                 "\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not applicable to \"UNNEST\"",
                 (allocator *)&alias);
      InvalidInputException::InvalidInputException(this_02,(string *)&value);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = &function->children;
    puVar30 = (function->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar17 = (function->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)puVar17 - (long)puVar30 == 8) {
      local_3e0 = 1;
    }
    else {
      bVar13 = false;
      local_3e0 = 1;
      for (uVar31 = 1; uVar31 < (ulong)((long)puVar17 - (long)puVar30 >> 3); uVar31 = uVar31 + 1) {
        if (bVar13) {
          ::std::__cxx11::string::string
                    ((string *)&value,"UNNEST() only supports a single additional argument",
                     (allocator *)&unnest_node);
          BinderException::BinderException<>
                    ((BinderException *)&alias,&function->super_ParsedExpression,(string *)&value);
          BindResult::BindResult(local_3d0,(Exception *)&alias);
          goto LAB_0128f930;
        }
        pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(this_00,uVar31);
        pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar19);
        iVar14 = (*(pPVar18->super_BaseExpression)._vptr_BaseExpression[6])(pPVar18);
        if ((char)iVar14 != '\0') {
          this_01 = (ParameterNotAllowedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&value,"Parameter not allowed in unnest parameter",
                     (allocator *)&alias);
          ParameterNotAllowedException::ParameterNotAllowedException(this_01,(string *)&value);
          __cxa_throw(this_01,&ParameterNotAllowedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(this_00,uVar31);
        pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar19);
        iVar14 = (*(pPVar18->super_BaseExpression)._vptr_BaseExpression[5])(pPVar18);
        if ((char)iVar14 == '\0') break;
        pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(this_00,uVar31);
        pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar19);
        StringUtil::Lower((string *)&alias,(string *)&(pPVar18->super_BaseExpression).alias);
        pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(this_00,uVar31);
        ExpressionBinder::BindChild((ExpressionBinder *)this,pvVar19,depth_local,&error);
        if (error.initialized != false) {
          ErrorData::ErrorData(&local_b0,&error);
          BindResult::BindResult(local_3d0,&local_b0);
          ErrorData::~ErrorData(&local_b0);
          this_04 = (Value *)&alias;
          goto LAB_0128f942;
        }
        pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(this_00,uVar31);
        pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar19);
        puVar22 = BoundExpression::GetExpression(pPVar21);
        pCVar5 = (this->super_BaseSelectBinder).super_ExpressionBinder.context;
        pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(puVar22);
        ExpressionExecutor::EvaluateScalar(&value,pCVar5,pEVar20,true);
        bVar12 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&alias,"recursive");
        if (bVar12) {
          bVar13 = Value::GetValue<bool>(&value);
          if (bVar13) {
            local_3e0 = 0xffffffffffffffff;
          }
        }
        else {
          bVar12 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&alias,"max_depth");
          if (!bVar12) {
            if (alias._M_string_length != 0) {
              pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&unnest_node,"Unsupported parameter \"%s\" for unnest",
                         (allocator *)&return_type);
              ::std::__cxx11::string::string((string *)&local_1d0,(string *)&alias);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar29,(string *)&unnest_node,&local_1d0);
              __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            Value::~Value(&value);
            ::std::__cxx11::string::~string((string *)&alias);
            break;
          }
          uVar15 = Value::GetValue<unsigned_int>(&value);
          if (uVar15 == 0) {
            pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&unnest_node,"UNNEST cannot have a max depth of 0",
                       (allocator *)&return_type);
            BinderException::BinderException(pBVar29,(string *)&unnest_node);
            __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_3e0 = (ulong)uVar15;
        }
        Value::~Value(&value);
        ::std::__cxx11::string::~string((string *)&alias);
        puVar30 = (function->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar17 = (function->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar13 = true;
      }
      if (!bVar13) {
        ::std::__cxx11::string::string
                  ((string *)&value,
                   "UNNEST - unsupported extra argument, unnest only supports recursive := [true/false] or max_depth := #"
                   ,(allocator *)&unnest_node);
        BinderException::BinderException<>
                  ((BinderException *)&alias,&function->super_ParsedExpression,(string *)&value);
        BindResult::BindResult(local_3d0,(Exception *)&alias);
        goto LAB_0128f930;
      }
    }
    this->unnest_level = this->unnest_level + 1;
    pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(this_00,0);
    ExpressionBinder::BindChild((ExpressionBinder *)this,pvVar19,depth_local,&error);
    if (error.initialized == true) {
      pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(this_00,0);
      ErrorData::ErrorData(&local_1b0,&error);
      ExpressionBinder::BindCorrelatedColumns
                ((BindResult *)&value,(ExpressionBinder *)this,pvVar19,&local_1b0);
      ErrorData::~ErrorData(&local_1b0);
      cVar10 = (char)value.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((char)value.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          '\x01') {
        ErrorData::ErrorData(&local_130,(ErrorData *)&value.type_.type_info_);
        BindResult::BindResult(local_3d0,&local_130);
        ErrorData::~ErrorData(&local_130);
      }
      else {
        pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(this_00,0);
        pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar19);
        puVar22 = BoundExpression::GetExpression(pPVar21);
        binder = (this->super_BaseSelectBinder).super_ExpressionBinder.binder;
        pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(puVar22);
        ExpressionBinder::ExtractCorrelatedExpressions(binder,pEVar20);
      }
      BindResult::~BindResult((BindResult *)&value);
      if (cVar10 != '\0') goto LAB_0128f947;
    }
    pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(this_00,0);
    pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar19);
    puVar22 = BoundExpression::GetExpression(pPVar21);
    pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar22);
    piVar1 = &this->unnest_level;
    *piVar1 = *piVar1 - 1;
    if (*piVar1 != 0) {
      pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&value,
                 "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels"
                 ,(allocator *)&alias);
      BinderException::BinderException<>(pBVar29,&function->super_ParsedExpression,(string *)&value)
      ;
      __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pLVar24 = &pEVar23->return_type;
    LVar2 = pLVar24->id_;
    if ((LVar2 - 100 < 2) || (LVar2 == SQLNULL)) {
      local_3d8._M_head_impl =
           (puVar22->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (puVar22->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      if (LVar2 == SQLNULL) {
        uVar31 = 1;
        bVar13 = true;
        local_2c0 = 0;
LAB_0128ff05:
        LogicalType::LogicalType(&return_type,pLVar24);
        while( true ) {
          uVar31 = uVar31 - 1;
          if (uVar31 == 0xffffffffffffffff) break;
          if (return_type.id_ == LIST) {
            pLVar24 = ListType::GetChildType(&return_type);
            LogicalType::operator=(&return_type,pLVar24);
          }
          make_uniq<duckdb::BoundUnnestExpression,duckdb::LogicalType&>
                    ((duckdb *)&local_398,&return_type);
          pBVar25 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                                  *)&local_398);
          _Var7._M_head_impl = local_3d8._M_head_impl;
          local_3d8._M_head_impl = (Expression *)0x0;
          _Var3._M_head_impl =
               (pBVar25->child).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pBVar25->child).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var7._M_head_impl;
          if (_Var3._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          }
          if ((function->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
            pBVar25 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                      ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                                    *)&local_398);
            (*(pBVar25->super_Expression).super_BaseExpression._vptr_BaseExpression[8])
                      (&alias,pBVar25);
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)&alias,
                       (string *)&(function->super_ParsedExpression).super_BaseExpression.alias);
          }
          current_level = this->unnest_level + uVar31;
          iVar26 = ::std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(((this->super_BaseSelectBinder).node)->unnests)._M_h,&current_level);
          peVar9 = local_398;
          if (iVar26.
              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
              ._M_cur == (__node_type *)0x0) {
            unnest_node.expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            unnest_node.expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            unnest_node.expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            unnest_node.index =
                 Binder::GenerateTableIndex
                           ((this->super_BaseSelectBinder).super_ExpressionBinder.binder);
            value.type_._0_8_ = local_398;
            local_398 = (element_type *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&unnest_node.expressions,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&value);
            if (value.type_._0_8_ != 0) {
              (**(code **)(*(long *)value.type_._0_8_ + 8))();
            }
            iVar32 = unnest_node.index;
            value.type_.id_ = (undefined1)current_level;
            value.type_.physical_type_ = current_level._1_1_;
            value.type_._2_6_ = current_level._2_6_;
            value.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)unnest_node.index;
            value.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   unnest_node.expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            value._24_8_ = unnest_node.expressions.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
            value.value_.bigint =
                 (int64_t)unnest_node.expressions.
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            unnest_node.expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            unnest_node.expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            unnest_node.expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::BoundUnnestNode>,std::allocator<std::pair<unsigned_long_const,duckdb::BoundUnnestNode>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,duckdb::BoundUnnestNode>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::BoundUnnestNode>,std::allocator<std::pair<unsigned_long_const,duckdb::BoundUnnestNode>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&((this->super_BaseSelectBinder).node)->unnests,&value);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)&value.type_.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector(&unnest_node.expressions.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     );
            value.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
          }
          else {
            iVar32 = *(idx_t *)((long)iVar26.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                                      ._M_cur + 0x10);
            lVar28 = *(long *)((long)iVar26.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                                     ._M_cur + 0x20);
            lVar4 = *(long *)((long)iVar26.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                                    ._M_cur + 0x18);
            local_398 = (element_type *)0x0;
            value.type_._0_8_ = peVar9;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)((long)iVar26.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                                 ._M_cur + 0x18),
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&value);
            if (value.type_._0_8_ != 0) {
              (**(code **)(*(long *)value.type_._0_8_ + 8))();
            }
            value.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)(lVar28 - lVar4 >> 3);
          }
          value.type_._0_8_ = iVar32;
          make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
                    ((duckdb *)&unnest_node,&alias,&return_type,(ColumnBinding *)&value,&depth_local
                    );
          iVar32 = unnest_node.index;
          _Var3._M_head_impl = local_3d8._M_head_impl;
          unnest_node.index = 0;
          local_3d8._M_head_impl = (Expression *)iVar32;
          if ((_Var3._M_head_impl != (Expression *)0x0) &&
             ((*((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
             unnest_node.index != 0)) {
            (**(code **)(*(long *)unnest_node.index + 8))();
          }
          ::std::__cxx11::string::~string((string *)&alias);
          if (local_398 != (element_type *)0x0) {
            (*local_398->_vptr_ExtraValueInfo[1])();
          }
        }
        if (!bVar13) {
          value.type_.id_ = INVALID;
          value.type_.physical_type_ = ~INVALID;
          value.type_._2_6_ = 0;
          value.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          value.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&value,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_3d8);
          lVar28 = 0;
          do {
            peVar11 = value.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (lVar28 == local_2c0) break;
            alias.field_2._M_allocated_capacity = 0;
            alias._M_dataplus._M_p = (pointer)0x0;
            alias._M_string_length = 0;
            bVar13 = false;
            for (this_05 = (element_type *)value.type_._0_8_; this_05 != peVar11;
                this_05 = (element_type *)&this_05->type) {
              pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)this_05);
              if ((pEVar23->return_type).id_ == STRUCT) {
                pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)this_05);
                pcVar27 = StructType::GetChildTypes_abi_cxx11_(&pEVar23->return_type);
                pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)this_05);
                bVar13 = StructType::IsUnnamed(&pEVar23->return_type);
                if (bVar13) {
                  for (iVar32 = 1;
                      iVar32 - 1 <
                      (ulong)(((long)(pcVar27->
                                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pcVar27->
                                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x38);
                      iVar32 = iVar32 + 1) {
                    pCVar5 = (this->super_BaseSelectBinder).super_ExpressionBinder.context;
                    pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                            *)this_05);
                    (*(pEVar23->super_BaseExpression)._vptr_BaseExpression[0x11])
                              (&local_360,pEVar23);
                    CreateBoundStructExtractIndex
                              ((duckdb *)&unnest_node,pCVar5,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_360,iVar32);
                    ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    ::
                    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                                *)&alias,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&unnest_node);
                    if (unnest_node.index != 0) {
                      (**(code **)(*(long *)unnest_node.index + 8))();
                    }
                    unnest_node.index = 0;
                    if (local_360._M_head_impl != (Expression *)0x0) {
                      (*((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    local_360._M_head_impl = (Expression *)0x0;
                  }
                }
                else {
                  ppVar6 = (pcVar27->
                           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           ).
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppVar33 = (pcVar27->
                                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                 ).
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; ppVar33 != ppVar6;
                      ppVar33 = ppVar33 + 1) {
                    pCVar5 = (this->super_BaseSelectBinder).super_ExpressionBinder.context;
                    pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                            *)this_05);
                    (*(pEVar23->super_BaseExpression)._vptr_BaseExpression[0x11])
                              (&local_370,pEVar23);
                    ::std::__cxx11::string::string((string *)&local_1f0,(string *)ppVar33);
                    CreateBoundStructExtract
                              ((duckdb *)&unnest_node,pCVar5,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_370,&local_1f0);
                    ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    ::
                    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                                *)&alias,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&unnest_node);
                    if (unnest_node.index != 0) {
                      (**(code **)(*(long *)unnest_node.index + 8))();
                    }
                    unnest_node.index = 0;
                    ::std::__cxx11::string::~string((string *)&local_1f0);
                    if (local_370._M_head_impl != (Expression *)0x0) {
                      (*((local_370._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    local_370._M_head_impl = (Expression *)0x0;
                  }
                }
                bVar13 = true;
              }
              else {
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&alias,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)this_05);
              }
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              *)&value,&alias);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)&alias);
            lVar28 = lVar28 + 1;
          } while (bVar13);
          make_uniq<duckdb::BoundExpandedExpression,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                    ((duckdb *)&alias,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)&value);
          _Var8 = alias._M_dataplus;
          _Var3._M_head_impl = local_3d8._M_head_impl;
          alias._M_dataplus._M_p = (pointer)0x0;
          local_3d8._M_head_impl = (Expression *)_Var8._M_p;
          if ((_Var3._M_head_impl != (Expression *)0x0) &&
             ((*((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
             alias._M_dataplus._M_p != (pointer)0x0)) {
            (**(code **)(*(long *)alias._M_dataplus._M_p + 8))();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&value);
        }
        local_368._M_head_impl = local_3d8._M_head_impl;
        local_3d8._M_head_impl = (Expression *)0x0;
        BindResult::BindResult
                  (local_3d0,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_368);
        if (local_368._M_head_impl != (Expression *)0x0) {
          (*((local_368._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_368._M_head_impl = (Expression *)0x0;
        LogicalType::~LogicalType(&return_type);
      }
      else {
        LogicalType::LogicalType(&value.type_,pLVar24);
        uVar31 = 0;
        do {
          if (value.type_.id_ != LIST) goto LAB_0128fecd;
          other = ListType::GetChildType(&value.type_);
          LogicalType::operator=(&value.type_,other);
          uVar31 = uVar31 + 1;
        } while (uVar31 < local_3e0);
        uVar31 = local_3e0 + (local_3e0 == 0);
LAB_0128fecd:
        lVar28 = 0;
        if (value.type_.id_ == STRUCT) {
          lVar28 = local_3e0 - uVar31;
        }
        LogicalType::~LogicalType(&value.type_);
        _Var3._M_head_impl = local_3d8._M_head_impl;
        bVar13 = lVar28 == 0;
        local_2c0 = lVar28;
        if (root_expression || bVar13) goto LAB_0128ff05;
        local_3d8._M_head_impl = (Expression *)0x0;
        _Var7._M_head_impl =
             (puVar22->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar22->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
        if (_Var7._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
        }
        ::std::__cxx11::string::string
                  ((string *)&value,
                   "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"
                   ,(allocator *)&unnest_node);
        BinderException::BinderException<>
                  ((BinderException *)&alias,&function->super_ParsedExpression,(string *)&value);
        BindResult::BindResult(local_3d0,(Exception *)&alias);
        ::std::runtime_error::~runtime_error((runtime_error *)&alias);
        ::std::__cxx11::string::~string((string *)&value);
      }
      if (local_3d8._M_head_impl != (Expression *)0x0) {
        (*((local_3d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      goto LAB_0128f947;
    }
    if (LVar2 == UNKNOWN) {
      this_03 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_03);
      __cxa_throw(this_03,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&value,"UNNEST() can only be applied to lists, structs and NULL, not %s",
               (allocator *)&unnest_node);
    LogicalType::ToString_abi_cxx11_(&local_290,pLVar24);
    BinderException::BinderException<std::__cxx11::string>
              ((BinderException *)&alias,&function->super_ParsedExpression,(string *)&value,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_290);
    BindResult::BindResult(local_3d0,(Exception *)&alias);
    ::std::runtime_error::~runtime_error((runtime_error *)&alias);
    ::std::__cxx11::string::~string((string *)&local_290);
  }
  this_04 = &value;
LAB_0128f942:
  ::std::__cxx11::string::~string((string *)this_04);
LAB_0128f947:
  ErrorData::~ErrorData(&error);
  return local_3d0;
}

Assistant:

BindResult SelectBinder::BindUnnest(FunctionExpression &function, idx_t depth, bool root_expression) {
	// bind the children of the function expression
	if (depth > 0) {
		return BindResult(BinderException(function, "UNNEST() for correlated expressions is not supported yet"));
	}

	ErrorData error;
	if (function.children.empty()) {
		return BindResult(BinderException(function, "UNNEST() requires a single argument"));
	}
	if (inside_window) {
		return BindResult(BinderException(function, UnsupportedUnnestMessage()));
	}

	if (function.distinct || function.filter || !function.order_bys->orders.empty()) {
		throw InvalidInputException("\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not "
		                            "applicable to \"UNNEST\"");
	}

	idx_t max_depth = 1;
	if (function.children.size() != 1) {
		bool has_parameter = false;
		bool supported_argument = false;
		for (idx_t i = 1; i < function.children.size(); i++) {
			if (has_parameter) {
				return BindResult(BinderException(function, "UNNEST() only supports a single additional argument"));
			}
			if (function.children[i]->HasParameter()) {
				throw ParameterNotAllowedException("Parameter not allowed in unnest parameter");
			}
			if (!function.children[i]->IsScalar()) {
				break;
			}
			auto alias = StringUtil::Lower(function.children[i]->GetAlias());
			BindChild(function.children[i], depth, error);
			if (error.HasError()) {
				return BindResult(std::move(error));
			}
			auto &const_child = BoundExpression::GetExpression(*function.children[i]);
			auto value = ExpressionExecutor::EvaluateScalar(context, *const_child, true);
			if (alias == "recursive") {
				auto recursive = value.GetValue<bool>();
				if (recursive) {
					max_depth = NumericLimits<idx_t>::Maximum();
				}
			} else if (alias == "max_depth") {
				max_depth = value.GetValue<uint32_t>();
				if (max_depth == 0) {
					throw BinderException("UNNEST cannot have a max depth of 0");
				}
			} else if (!alias.empty()) {
				throw BinderException("Unsupported parameter \"%s\" for unnest", alias);
			} else {
				break;
			}
			has_parameter = true;
			supported_argument = true;
		}
		if (!supported_argument) {
			return BindResult(BinderException(function, "UNNEST - unsupported extra argument, unnest only supports "
			                                            "recursive := [true/false] or max_depth := #"));
		}
	}
	unnest_level++;
	BindChild(function.children[0], depth, error);
	if (error.HasError()) {
		// failed to bind
		// try to bind correlated columns manually
		auto result = BindCorrelatedColumns(function.children[0], error);
		if (result.HasError()) {
			return BindResult(result.error);
		}
		auto &bound_expr = BoundExpression::GetExpression(*function.children[0]);
		ExtractCorrelatedExpressions(binder, *bound_expr);
	}
	auto &child = BoundExpression::GetExpression(*function.children[0]);
	auto &child_type = child->return_type;
	unnest_level--;

	if (unnest_level > 0) {
		throw BinderException(
		    function,
		    "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels");
	}

	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::LIST:
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::SQLNULL:
		break;
	default:
		return BindResult(BinderException(function, "UNNEST() can only be applied to lists, structs and NULL, not %s",
		                                  child_type.ToString()));
	}

	idx_t list_unnests;
	idx_t struct_unnests = 0;

	auto unnest_expr = std::move(child);
	if (child_type.id() == LogicalTypeId::SQLNULL) {
		list_unnests = 1;
	} else {
		// perform all LIST unnests
		auto type = child_type;
		list_unnests = 0;
		while (type.id() == LogicalTypeId::LIST) {
			type = ListType::GetChildType(type);
			list_unnests++;
			if (list_unnests >= max_depth) {
				break;
			}
		}
		// unnest structs
		if (type.id() == LogicalTypeId::STRUCT) {
			struct_unnests = max_depth - list_unnests;
		}
	}
	if (struct_unnests > 0 && !root_expression) {
		child = std::move(unnest_expr);
		return BindResult(BinderException(
		    function, "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"));
	}
	// perform all LIST unnests
	auto return_type = child_type;
	for (idx_t current_depth = 0; current_depth < list_unnests; current_depth++) {
		if (return_type.id() == LogicalTypeId::LIST) {
			return_type = ListType::GetChildType(return_type);
		}
		auto result = make_uniq<BoundUnnestExpression>(return_type);
		result->child = std::move(unnest_expr);
		auto alias = function.GetAlias().empty() ? result->ToString() : function.GetAlias();

		auto current_level = unnest_level + list_unnests - current_depth - 1;
		auto entry = node.unnests.find(current_level);
		idx_t unnest_table_index;
		idx_t unnest_column_index;
		if (entry == node.unnests.end()) {
			BoundUnnestNode unnest_node;
			unnest_node.index = binder.GenerateTableIndex();
			unnest_node.expressions.push_back(std::move(result));
			unnest_table_index = unnest_node.index;
			unnest_column_index = 0;
			node.unnests.insert(make_pair(current_level, std::move(unnest_node)));
		} else {
			unnest_table_index = entry->second.index;
			unnest_column_index = entry->second.expressions.size();
			entry->second.expressions.push_back(std::move(result));
		}
		// now create a column reference referring to the unnest
		unnest_expr = make_uniq<BoundColumnRefExpression>(
		    std::move(alias), return_type, ColumnBinding(unnest_table_index, unnest_column_index), depth);
	}
	// now perform struct unnests, if any
	if (struct_unnests > 0) {
		vector<unique_ptr<Expression>> struct_expressions;
		struct_expressions.push_back(std::move(unnest_expr));

		for (idx_t i = 0; i < struct_unnests; i++) {
			vector<unique_ptr<Expression>> new_expressions;
			// check if there are any structs left
			bool has_structs = false;
			for (auto &expr : struct_expressions) {
				if (expr->return_type.id() == LogicalTypeId::STRUCT) {
					// struct! push a struct_extract
					auto &child_types = StructType::GetChildTypes(expr->return_type);
					if (StructType::IsUnnamed(expr->return_type)) {
						for (idx_t child_index = 0; child_index < child_types.size(); child_index++) {
							new_expressions.push_back(
							    CreateBoundStructExtractIndex(context, expr->Copy(), child_index + 1));
						}
					} else {
						for (auto &entry : child_types) {
							new_expressions.push_back(CreateBoundStructExtract(context, expr->Copy(), entry.first));
						}
					}
					has_structs = true;
				} else {
					// not a struct - push as-is
					new_expressions.push_back(std::move(expr));
				}
			}
			struct_expressions = std::move(new_expressions);
			if (!has_structs) {
				break;
			}
		}
		unnest_expr = make_uniq<BoundExpandedExpression>(std::move(struct_expressions));
	}
	return BindResult(std::move(unnest_expr));
}